

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testFutureProofing.cpp
# Opt level: O1

bool anon_unknown.dwarf_2046e7::checkPixels<Imath_3_2::half>
               (Array2D<unsigned_int> *sampleCount,Array2D<Imath_3_2::half_*> *ph,int lx,int rx,
               int ly,int ry,int width)

{
  long lVar1;
  float *pfVar2;
  bool bVar3;
  uint uVar4;
  char cVar5;
  ulong uVar6;
  ostream *poVar7;
  long *plVar8;
  float fVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  ulong uVar17;
  bool bVar18;
  float fVar19;
  bool local_7b;
  long local_78;
  
  local_7b = ry < ly;
  if (ly <= ry) {
    local_78 = (long)ly;
    do {
      if (lx <= rx) {
        lVar10 = (long)lx;
        bVar3 = rx < lx;
        do {
          uVar6 = (ulong)sampleCount->_data[sampleCount->_sizeY * local_78 + lVar10];
          bVar18 = uVar6 != 0;
          if (bVar18) {
            iVar16 = ((int)local_78 * width + (int)lVar10) % 0x801;
            fVar19 = (float)iVar16;
            fVar9 = ABS(fVar19);
            uVar13 = (uint)fVar19 & 0x7fffff | 0x800000;
            cVar5 = (char)((uint)fVar19 >> 0x17);
            uVar11 = (uint)fVar19 >> 0x10 & 0x8000;
            uVar12 = (uint)fVar19 >> 0xd & 0x3ff;
            uVar12 = uVar12 == 0 | uVar12;
            uVar14 = uVar11 + 0x7c00;
            if ((uint)fVar9 < 0x477ff000) {
              uVar14 = (int)fVar9 + 0x8000fff + (uint)(((uint)fVar9 >> 0xd & 1) != 0) >> 0xd |
                       uVar11;
            }
            if (fVar9 == INFINITY) {
              uVar12 = 0;
            }
            uVar17 = 0;
            do {
              uVar15 = uVar14;
              if (0x7f7fffff < (uint)fVar9) {
                uVar15 = uVar11 + uVar12 + 0x7c00;
              }
              uVar4 = (uint)(0x80000000 < uVar13 << (cVar5 + 0xa2U & 0x1f)) +
                      (uVar13 >> (0x7eU - cVar5 & 0x1f) | uVar11);
              if ((uint)fVar9 < 0x33000001) {
                uVar4 = uVar11;
              }
              fVar19 = *(float *)(_imath_half_to_float_table +
                                 (ulong)ph->_data[ph->_sizeY * local_78 + lVar10][uVar17]._h * 4);
              if (0x387fffff < (uint)fVar9) {
                uVar4 = uVar15;
              }
              pfVar2 = (float *)(_imath_half_to_float_table + ((ulong)uVar4 & 0xffff) * 4);
              if ((fVar19 != *pfVar2) || (NAN(fVar19) || NAN(*pfVar2))) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"value at ",9);
                poVar7 = (ostream *)std::ostream::operator<<(&std::cout,(int)lVar10);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,", ",2);
                poVar7 = (ostream *)std::ostream::operator<<(poVar7,(int)local_78);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,", sample ",9);
                poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,": ",2);
                poVar7 = (ostream *)
                         ::operator<<(poVar7,(half)ph->_data[ph->_sizeY * local_78 + lVar10][uVar17]
                                                   ._h);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,", should be ",0xc);
                plVar8 = (long *)std::ostream::operator<<(poVar7,iVar16);
                std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
                std::ostream::put((char)plVar8);
                std::ostream::flush();
                std::ostream::flush();
                if (bVar18) {
                  if (!bVar3) {
                    return local_7b;
                  }
                  goto LAB_0017ab39;
                }
                break;
              }
              uVar17 = uVar17 + 1;
              bVar18 = uVar17 < uVar6;
            } while (uVar17 != uVar6);
          }
          lVar1 = lVar10 + 1;
          bVar3 = rx <= lVar10;
          lVar10 = lVar1;
        } while (rx + 1 != (int)lVar1);
      }
LAB_0017ab39:
      lVar10 = local_78 + 1;
      local_7b = ry <= local_78;
      local_78 = lVar10;
    } while (ry + 1 != (int)lVar10);
  }
  return local_7b;
}

Assistant:

bool
checkPixels (
    Array2D<unsigned int>& sampleCount,
    Array2D<T*>&           ph,
    int                    lx,
    int                    rx,
    int                    ly,
    int                    ry,
    int                    width)
{
    for (int y = ly; y <= ry; ++y)
    {
        for (int x = lx; x <= rx; ++x)
        {
            for (unsigned int i = 0; i < sampleCount[y][x]; i++)
            {
                if (ph[y][x][i] != static_cast<T> (((y * width + x) % 2049)))
                {
                    cout << "value at " << x << ", " << y << ", sample " << i
                         << ": " << ph[y][x][i] << ", should be "
                         << (y * width + x) % 2049 << endl
                         << flush;
                    return false;
                }
            }
        }
    }

    return true;
}